

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::JunitReporter::writeGroup(JunitReporter *this,TestGroupNode *groupNode,double suiteTime)

{
  bool bVar1;
  int iVar2;
  TestCaseNode *testCaseNode;
  IConfig *pIVar3;
  string *name;
  reference this_00;
  string *text;
  long in_RSI;
  long in_RDI;
  const_iterator itEnd;
  const_iterator it;
  TestGroupStats *stats;
  ScopedElement e;
  vector<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>
  *in_stack_fffffffffffffc98;
  string *in_stack_fffffffffffffca0;
  allocator *this_01;
  string *in_stack_fffffffffffffca8;
  XmlWriter *in_stack_fffffffffffffcb0;
  allocator *this_02;
  string *in_stack_fffffffffffffcc0;
  XmlWriter *in_stack_fffffffffffffcc8;
  XmlWriter *this_03;
  string *in_stack_fffffffffffffcd8;
  JunitReporter *this_04;
  string local_2a0 [32];
  string local_280 [39];
  allocator local_259;
  string local_258 [40];
  string local_230 [32];
  string local_210 [39];
  allocator local_1e9;
  string local_1e8 [40];
  Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>
  *local_1c0;
  __normal_iterator<const_Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_*,_std::vector<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>_>
  local_1b8;
  undefined1 local_1a9 [40];
  undefined1 local_181 [40];
  allocator local_159;
  string local_158 [39];
  allocator local_131;
  string local_130 [32];
  size_t local_110;
  undefined1 local_101 [33];
  long local_e0;
  allocator local_d1;
  string local_d0 [39];
  allocator local_a9;
  string local_a8 [39];
  allocator local_81;
  string local_80 [32];
  long local_60;
  allocator local_41;
  string local_40 [64];
  
  local_40._48_8_ = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"testsuite",&local_41);
  XmlWriter::scopedElement(in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  local_60 = local_40._48_8_ + 0x10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"name",&local_81);
  XmlWriter::writeAttribute
            (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8,"errors",&local_a9);
  XmlWriter::writeAttribute<unsigned_int>
            (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,(uint *)in_stack_fffffffffffffca0);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d0,"failures",&local_d1);
  local_e0 = *(long *)(local_60 + 0x40) - (ulong)*(uint *)(in_RDI + 0x400);
  XmlWriter::writeAttribute<unsigned_long>
            (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
             (unsigned_long *)in_stack_fffffffffffffca0);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  testCaseNode = (TestCaseNode *)(in_RDI + 0xc0);
  this_04 = (JunitReporter *)local_101;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_101 + 1),"tests",(allocator *)this_04);
  local_110 = Counts::total((Counts *)(local_60 + 0x38));
  XmlWriter::writeAttribute<unsigned_long>
            (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
             (unsigned_long *)in_stack_fffffffffffffca0);
  std::__cxx11::string::~string((string *)(local_101 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_101);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,"hostname",&local_131);
  XmlWriter::writeAttribute<char[4]>
            (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
             (char (*) [4])in_stack_fffffffffffffca0);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  pIVar3 = Ptr<Catch::IConfig>::operator->((Ptr<Catch::IConfig> *)(in_RDI + 0x10));
  iVar2 = (*(pIVar3->super_IShared).super_NonCopyable._vptr_NonCopyable[0xc])();
  if (iVar2 == 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_158,"time",&local_159);
    XmlWriter::writeAttribute<char[1]>
              (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
               (char (*) [1])in_stack_fffffffffffffca0);
    std::__cxx11::string::~string(local_158);
    std::allocator<char>::~allocator((allocator<char> *)&local_159);
  }
  else {
    in_stack_fffffffffffffcd8 = (string *)local_181;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_181 + 1),"time",(allocator *)in_stack_fffffffffffffcd8);
    XmlWriter::writeAttribute<double>
              (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
               (double *)in_stack_fffffffffffffca0);
    std::__cxx11::string::~string((string *)(local_181 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_181);
  }
  name = (string *)(in_RDI + 0xc0);
  this_03 = (XmlWriter *)local_1a9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_1a9 + 1),"timestamp",(allocator *)this_03);
  XmlWriter::writeAttribute<char[4]>
            (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
             (char (*) [4])in_stack_fffffffffffffca0);
  std::__cxx11::string::~string((string *)(local_1a9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_1a9);
  local_1b8._M_current =
       (Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>
        *)std::
          vector<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>
          ::begin(in_stack_fffffffffffffc98);
  local_1c0 = (Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>
               *)std::
                 vector<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>
                 ::end(in_stack_fffffffffffffc98);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_*,_std::vector<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>_>
                        *)in_stack_fffffffffffffca0,
                       (__normal_iterator<const_Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_*,_std::vector<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>_>
                        *)in_stack_fffffffffffffc98);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_*,_std::vector<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>_>
              ::operator*(&local_1b8);
    Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>
    ::operator*(this_00);
    writeTestCase(this_04,testCaseNode);
    __gnu_cxx::
    __normal_iterator<const_Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_*,_std::vector<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>_>
    ::operator++(&local_1b8);
  }
  text = (string *)(in_RDI + 0xc0);
  this_02 = &local_1e9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e8,"system-out",this_02);
  XmlWriter::scopedElement(this_03,name);
  std::__cxx11::ostringstream::str();
  trim(in_stack_fffffffffffffcd8);
  XmlWriter::ScopedElement::writeText
            ((ScopedElement *)this_02,text,SUB81((ulong)in_stack_fffffffffffffca0 >> 0x38,0));
  std::__cxx11::string::~string(local_210);
  std::__cxx11::string::~string(local_230);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_fffffffffffffca0);
  std::__cxx11::string::~string(local_1e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  this_01 = &local_259;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_258,"system-err",this_01);
  XmlWriter::scopedElement(this_03,name);
  std::__cxx11::ostringstream::str();
  trim(in_stack_fffffffffffffcd8);
  XmlWriter::ScopedElement::writeText((ScopedElement *)this_02,text,SUB81((ulong)this_01 >> 0x38,0))
  ;
  std::__cxx11::string::~string(local_280);
  std::__cxx11::string::~string(local_2a0);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)this_01);
  std::__cxx11::string::~string(local_258);
  std::allocator<char>::~allocator((allocator<char> *)&local_259);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)this_01);
  return;
}

Assistant:

void writeGroup( TestGroupNode const& groupNode, double suiteTime ) {
            XmlWriter::ScopedElement e = xml.scopedElement( "testsuite" );
            TestGroupStats const& stats = groupNode.value;
            xml.writeAttribute( "name", stats.groupInfo.name );
            xml.writeAttribute( "errors", unexpectedExceptions );
            xml.writeAttribute( "failures", stats.totals.assertions.failed-unexpectedExceptions );
            xml.writeAttribute( "tests", stats.totals.assertions.total() );
            xml.writeAttribute( "hostname", "tbd" ); // !TBD
            if( m_config->showDurations() == ShowDurations::Never )
                xml.writeAttribute( "time", "" );
            else
                xml.writeAttribute( "time", suiteTime );
            xml.writeAttribute( "timestamp", "tbd" ); // !TBD

            // Write test cases
            for( TestGroupNode::ChildNodes::const_iterator
                    it = groupNode.children.begin(), itEnd = groupNode.children.end();
                    it != itEnd;
                    ++it )
                writeTestCase( **it );

            xml.scopedElement( "system-out" ).writeText( trim( stdOutForSuite.str() ), false );
            xml.scopedElement( "system-err" ).writeText( trim( stdErrForSuite.str() ), false );
        }